

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::LtrimFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *ltrim;
  allocator_type *in_stack_fffffffffffffb68;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb70;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb78;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb84;
  LogicalType *local_400;
  LogicalType *local_3e0;
  LogicalType local_3c0 [24];
  undefined1 local_3a8 [32];
  LogicalType local_388 [32];
  LogicalType *local_368;
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  LogicalType *local_330;
  undefined8 local_328;
  undefined1 local_320 [24];
  ScalarFunction local_308;
  LogicalType local_1e0 [24];
  undefined1 local_1c8 [32];
  LogicalType local_1a8 [40];
  LogicalType *local_180;
  LogicalType local_178 [24];
  LogicalType *local_160;
  undefined8 local_158;
  undefined1 local_150 [24];
  ScalarFunction local_138;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_180 = local_178;
  duckdb::LogicalType::LogicalType(local_180,VARCHAR);
  local_160 = local_178;
  local_158 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe994cc);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffb80;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb78;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffb84;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb70,iVar1,in_stack_fffffffffffffb68);
  duckdb::LogicalType::LogicalType(local_1a8,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),in_stack_fffffffffffffb78
            );
  duckdb::LogicalType::LogicalType(local_1e0,INVALID);
  __f = local_1e0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_138,local_150,local_1a8,local_1c8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_1e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe995cd);
  duckdb::LogicalType::~LogicalType(local_1a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe995e7);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe995f4);
  local_3e0 = (LogicalType *)&local_160;
  do {
    local_3e0 = local_3e0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_3e0);
  } while (local_3e0 != local_178);
  local_368 = local_360;
  duckdb::LogicalType::LogicalType(local_368,VARCHAR);
  local_368 = local_348;
  duckdb::LogicalType::LogicalType(local_368,VARCHAR);
  local_330 = local_360;
  local_328 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe996af);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffb84;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  duckdb::LogicalType::LogicalType(local_388,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb84,uVar5),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_3c0,INVALID);
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_308,local_320,local_388,local_3a8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  duckdb::LogicalType::~LogicalType(local_3c0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe997b0);
  duckdb::LogicalType::~LogicalType(local_388);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe997ca);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe997d7);
  local_400 = (LogicalType *)&local_330;
  do {
    local_400 = local_400 + -0x18;
    duckdb::LogicalType::~LogicalType(local_400);
  } while (local_400 != local_360);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LtrimFun::GetFunctions() {
	ScalarFunctionSet ltrim;
	ltrim.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, UnaryTrimFunction<true, false>));
	ltrim.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                                 BinaryTrimFunction<true, false>));
	return ltrim;
}